

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

FEvent * __thiscall FEventTree::GetMinimum(FEventTree *this)

{
  FEventTree *local_20;
  FEvent *node;
  FEventTree *this_local;
  
  local_20 = (FEventTree *)this->Root;
  if (local_20 == this) {
    this_local = (FEventTree *)0x0;
  }
  else {
    for (; (FEventTree *)(local_20->Nil).Left != this; local_20 = (FEventTree *)(local_20->Nil).Left
        ) {
    }
    this_local = local_20;
  }
  return &this_local->Nil;
}

Assistant:

FEvent *FEventTree::GetMinimum ()
{
	FEvent *node = Root;

	if (node == &Nil)
	{
		return NULL;
	}
	while (node->Left != &Nil)
	{
		node = node->Left;
	}
	return node;
}